

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralAttributeCheck.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::GeneralAttributeCheck::checkAttributes
          (GeneralAttributeCheck *this,DOMElement *elem,unsigned_short elemContext,
          TraverseSchema *schema,bool isTopLevel,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  long lVar5;
  undefined4 extraout_var_02;
  XMLCh *str1_00;
  undefined4 extraout_var_04;
  unsigned_short *puVar6;
  ulong uVar7;
  undefined4 extraout_var_05;
  uint j;
  long lVar8;
  DOMNode *attribute;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *local_70;
  uint local_64;
  GeneralAttributeCheck *local_60;
  XMLByte attList [34];
  XMLCh *text1;
  XMLCh *str1;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
    nonXSAttList->fCurCount = 0;
  }
  if (((elemContext < 0x32) && (elem != (DOMElement *)0x0)) &&
     (fAttMap != (ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher> *)0x0)) {
    local_70 = nonXSAttList;
    local_60 = this;
    iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0x18])(elem);
    text1 = (XMLCh *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0x16])(elem);
    bVar1 = XMLString::equals((XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                              (XMLCh *)CONCAT44(extraout_var_00,iVar2));
    if (!bVar1) {
      TraverseSchema::reportSchemaError
                (schema,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x94,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    iVar2 = (*(elem->super_DOMNode)._vptr_DOMNode[0xb])(elem);
    plVar4 = (long *)CONCAT44(extraout_var_01,iVar2);
    lVar5 = (**(code **)(*plVar4 + 0x28))(plVar4);
    attList[0x10] = '\0';
    attList[0x11] = '\0';
    attList[0x12] = '\0';
    attList[0x13] = '\0';
    attList[0x14] = '\0';
    attList[0x15] = '\0';
    attList[0x16] = '\0';
    attList[0x17] = '\0';
    attList[0x18] = '\0';
    attList[0x19] = '\0';
    attList[0x1a] = '\0';
    attList[0x1b] = '\0';
    attList[0x1c] = '\0';
    attList[0x1d] = '\0';
    attList[0x1e] = '\0';
    attList[0x1f] = '\0';
    attList[0x20] = '\0';
    attList[0x21] = '\0';
    attList[0] = '\0';
    attList[1] = '\0';
    attList[2] = '\0';
    attList[3] = '\0';
    attList[4] = '\0';
    attList[5] = '\0';
    attList[6] = '\0';
    attList[7] = '\0';
    attList[8] = '\0';
    attList[9] = '\0';
    attList[10] = '\0';
    attList[0xb] = '\0';
    attList[0xc] = '\0';
    attList[0xd] = '\0';
    attList[0xe] = '\0';
    attList[0xf] = '\0';
    local_64 = (uint)isTopLevel;
    iVar2 = 0x52 - local_64;
    for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
      attribute = (DOMNode *)(**(code **)(*plVar4 + 0x18))(plVar4,lVar8);
      iVar3 = (*attribute->_vptr_DOMNode[2])(attribute);
      str1 = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
      bVar1 = XMLString::equals(str1,(XMLCh *)XMLUni::fgXMLNSString);
      if ((!bVar1) &&
         (bVar1 = XMLString::startsWith(str1,(XMLCh *)XMLUni::fgXMLNSColonString), !bVar1)) {
        if (((XMLCh)(*str1 | 0x20U) == 0x78) &&
           (((XMLCh)(str1[1] | 0x20U) == 0x6d && ((XMLCh)(str1[2] | 0x20U) == 0x6c)))) {
LAB_002fe68e:
          if (local_70 != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
            ValueVectorOf<xercesc_4_0::DOMNode_*>::addElement(local_70,&attribute);
          }
        }
        else {
          iVar3 = (*attribute->_vptr_DOMNode[0x16])();
          str1_00 = (XMLCh *)CONCAT44(extraout_var_03,iVar3);
          if ((str1_00 == (XMLCh *)0x0) || (*str1_00 == L'\0')) {
            iVar3 = (*attribute->_vptr_DOMNode[0x18])();
            str1 = (XMLCh *)CONCAT44(extraout_var_04,iVar3);
            puVar6 = ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher>::get
                               (fAttMap,str1,local_60->fMemoryManager);
            uVar7 = (ulong)*puVar6;
            if ((fgElemAttTable[uVar7 * 2 + (ulong)elemContext * 0x44] & 3) != 0) {
              attList[uVar7] = '\x01';
              iVar3 = (*attribute->_vptr_DOMNode[3])();
              validate(local_60,elem,str1,(XMLCh *)CONCAT44(extraout_var_05,iVar3),
                       *(ushort *)(fgElemAttTable + uVar7 * 2 + (ulong)elemContext * 0x44) & 0x1ffc,
                       schema);
              goto LAB_002fe7a6;
            }
          }
          else {
            bVar1 = XMLString::equals(str1_00,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            if (((!bVar1) &&
                (bVar1 = XMLString::equals(text1,(XMLCh *)SchemaSymbols::fgELT_APPINFO), !bVar1)) &&
               (bVar1 = XMLString::equals(text1,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION), !bVar1
               )) goto LAB_002fe68e;
          }
          TraverseSchema::reportSchemaError
                    (schema,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar2,str1,text1,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
      }
LAB_002fe7a6:
    }
    iVar2 = 0x50 - local_64;
    for (lVar5 = 0; lVar5 != 0x22; lVar5 = lVar5 + 1) {
      if (((fgElemAttTable[lVar5 * 2 + (ulong)elemContext * 0x44] & 1) != 0) &&
         (attList[lVar5] == '\0')) {
        TraverseSchema::reportSchemaError
                  (schema,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar2,(XMLCh *)(&fAttNames)[lVar5],
                   text1,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
GeneralAttributeCheck::checkAttributes(const DOMElement* const elem,
                                       const unsigned short elemContext,
                                       TraverseSchema* const schema,
                                       const bool isTopLevel,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList)
{
    if (nonXSAttList)
        nonXSAttList->removeAllElements();

    if (elem == 0 || !fAttMap || elemContext>=E_Count)
        return;

    const XMLCh* elemName = elem->getLocalName();
    if (!XMLString::equals(SchemaSymbols::fgURI_SCHEMAFORSCHEMA, elem->getNamespaceURI())) {
        schema->reportSchemaError
        (
            elem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::ELTSchemaNS
            , elemName
        );
    }

    DOMNamedNodeMap* eltAttrs = elem->getAttributes();
    const XMLSize_t  attrCount = eltAttrs->getLength();
    XMLByte          attList[A_Count];

    memset(attList, 0, sizeof(attList));

    for (XMLSize_t i = 0; i < attrCount; i++) {

        DOMNode*     attribute = eltAttrs->item(i);
        const XMLCh* attName = attribute->getNodeName();

        // skip namespace declarations
        if (XMLString::equals(attName, XMLUni::fgXMLNSString)
            || XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            continue;

        // Bypass attributes that start with xml
        // add this to the list of "non-schema" attributes
        if ((*attName == chLatin_X || *attName == chLatin_x)
           && (*(attName+1) == chLatin_M || *(attName+1) == chLatin_m)
           && (*(attName+2) == chLatin_L || *(attName+2) == chLatin_l)) {

           if (nonXSAttList)
                nonXSAttList->addElement(attribute);

            continue;
        }

        // for attributes with namespace prefix
        const XMLCh* attrURI = attribute->getNamespaceURI();

        if (attrURI != 0 && *attrURI) {

            // attributes with schema namespace are not allowed
            // and not allowed on "documentation" and "appInfo"
            if (XMLString::equals(attrURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_APPINFO) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_DOCUMENTATION)) {

                schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                          isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                          attName, elemName);
            }
            else if (nonXSAttList)
            {
                nonXSAttList->addElement(attribute);
            }

            continue;
        }

        int attNameId = A_Invalid;
        attName = attribute->getLocalName();

        bool bContinue=false;   // workaround for Borland bug with 'continue' in 'catch'
        try {
            attNameId= fAttMap->get(attName, fMemoryManager);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {

            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
            bContinue=true;
        }
        if(bContinue)
            continue;

        if (fgElemAttTable[elemContext][attNameId] & Att_Mask) {

            attList[attNameId] = 1;
            validate
            (
                elem
                , attName
                , attribute->getNodeValue()
                , fgElemAttTable[elemContext][attNameId] & DV_Mask
                , schema
            );
        }
        else {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
        }
    }

    // ------------------------------------------------------------------
    // Check for required attributes
    // ------------------------------------------------------------------
    for (unsigned int j=0; j < A_Count; j++) {

        if ((fgElemAttTable[elemContext][j] & Att_Required) && attList[j] == 0) {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain, 
                                      isTopLevel?XMLErrs::AttributeRequiredGlobal:XMLErrs::AttributeRequiredLocal, 
                                      fAttNames[j], elemName);
        }
    }
}